

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  Fts5Config *pConfig;
  int rc;
  int local_1c;
  
  pConfig = ((Fts5Storage *)pVtab[1].zErrMsg)->pConfig;
  local_1c = sqlite3Fts5StorageSync((Fts5Storage *)pVtab[1].zErrMsg);
  fts5StorageRenameOne(pConfig,&local_1c,"data",zName);
  fts5StorageRenameOne(pConfig,&local_1c,"idx",zName);
  fts5StorageRenameOne(pConfig,&local_1c,"config",zName);
  if (pConfig->bColumnsize != 0) {
    fts5StorageRenameOne(pConfig,&local_1c,"docsize",zName);
  }
  if (pConfig->eContent == 0) {
    fts5StorageRenameOne(pConfig,&local_1c,"content",zName);
  }
  return local_1c;
}

Assistant:

static int fts5RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  return sqlite3Fts5StorageRename(pTab->pStorage, zName);
}